

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O0

void free_cached_groups(void)

{
  R3410_ec_params *params;
  R3410_ec_params *local_8;
  
  for (local_8 = R3410_2012_512_paramset; local_8->nid != 0; local_8 = local_8 + 1) {
    EC_GROUP_free((EC_GROUP *)local_8->group);
    local_8->group = (EC_GROUP *)0x0;
  }
  for (local_8 = R3410_2001_paramset; local_8->nid != 0; local_8 = local_8 + 1) {
    EC_GROUP_free((EC_GROUP *)local_8->group);
    local_8->group = (EC_GROUP *)0x0;
  }
  return;
}

Assistant:

void free_cached_groups()
{
    R3410_ec_params *params;

    /* Search nid in 2012 paramset */
    params = R3410_2012_512_paramset;
    while (params->nid != NID_undef) {
	EC_GROUP_free(params->group);
	params->group = NULL;
        params++;
    }

    /* Search nid in 2001 paramset */
    params = R3410_2001_paramset;
    while (params->nid != NID_undef) {
	EC_GROUP_free(params->group);
	params->group = NULL;
        params++;
    }
}